

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterHasNoReset.cpp
# Opt level: O2

void __thiscall
register_has_no_reset::AlwaysFFVisitor::handle
          (AlwaysFFVisitor *this,ConditionalStatement *statement)

{
  int iVar1;
  pointer pCVar2;
  size_t sVar3;
  int *piVar4;
  bool bVar5;
  long lVar6;
  Statement *pSVar7;
  Statement *this_00;
  Statement *this_01;
  LookupLhsIdentifier visitor;
  LookupIdentifier lookupIdentifierVisitor;
  undefined4 local_8f;
  undefined3 uStack_8b;
  LookupLhsIdentifier local_88;
  LookupIdentifier local_58;
  
  if (statement->ifFalse != (Statement *)0x0) {
    local_58.name._M_len = *(size_t *)(this + 0x10);
    local_58.name._M_str = *(char **)(this + 0x18);
    local_58.exactMatching = false;
    local_58._found = false;
    local_58._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
    super__Optional_payload_base<slang::SourceLocation>._M_engaged = false;
    pCVar2 = (statement->conditions)._M_ptr;
    sVar3 = (statement->conditions)._M_extent._M_extent_value;
    for (lVar6 = 0; sVar3 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
      slang::ast::Expression::visit<LookupIdentifier&>
                (*(Expression **)((long)&(pCVar2->expr).ptr + lVar6),&local_58);
      if (local_58._found == true) {
        piVar4 = *(int **)((long)&(pCVar2->expr).ptr + lVar6);
        if (*piVar4 == 10) {
          iVar1 = piVar4[0xc];
          this_01 = statement->ifTrue;
          this_00 = statement->ifFalse;
          if ((iVar1 != 9) && (iVar1 != 2)) goto LAB_0017dda3;
          pSVar7 = this_00;
          if (this[0x20] != (AlwaysFFVisitor)0x0) goto LAB_0017ddb2;
        }
        else {
          this_01 = statement->ifTrue;
          this_00 = statement->ifFalse;
LAB_0017dda3:
          pSVar7 = this_00;
          if (this[0x20] != (AlwaysFFVisitor)0x1) goto LAB_0017ddb2;
        }
        this_00 = this_01;
        this_01 = pSVar7;
LAB_0017ddb2:
        local_88.name._M_len = *(size_t *)this;
        local_88.name._M_str = *(char **)(this + 8);
        local_88._found = false;
        local_88._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceLocation>._M_engaged = false;
        slang::ast::Statement::visit<LookupLhsIdentifier&>(this_00,&local_88);
        bVar5 = local_88._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>.
                _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_engaged;
        if (local_88._found != true) {
          return;
        }
        local_88._found = false;
        local_88._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceLocation>._M_engaged = false;
        slang::ast::Statement::visit<LookupLhsIdentifier&>(this_01,&local_88);
        if (local_88._found != false) {
          return;
        }
        this[0x21] = (AlwaysFFVisitor)0x1;
        *(_Storage<slang::SourceLocation,_true> *)(this + 0x28) =
             local_88._foundLocation.super__Optional_base<slang::SourceLocation,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::SourceLocation>._M_payload;
        this[0x30] = (AlwaysFFVisitor)bVar5;
        *(undefined4 *)(this + 0x31) = local_8f;
        *(uint *)(this + 0x34) = CONCAT31(uStack_8b,local_8f._3_1_);
        return;
      }
    }
  }
  return;
}

Assistant:

void handle(const ConditionalStatement& statement) {
        // Early return, if there's no else clause on the conditional statement
        if (!statement.ifFalse) {
            return;
        }

        // Check if there is a reset in the conditional statement and if the signal is negated
        bool isReset = false;
        bool isResetNeg = false;

        LookupIdentifier lookupIdentifierVisitor(resetName, false);
        for (const auto& condition : statement.conditions) {
            condition.expr->visit(lookupIdentifierVisitor);
            isReset = lookupIdentifierVisitor.found();

            if (isReset) {
                if (condition.expr->kind == ExpressionKind::UnaryOp) {
                    auto op = condition.expr->as<UnaryExpression>().op;
                    isResetNeg = (op == UnaryOperator::BitwiseNot) ||
                                 (op == UnaryOperator::LogicalNot);
                }
                break;
            }
        }

        if (!isReset)
            return;

        auto resetStatement = &statement.ifTrue;
        auto noResetStatement = statement.ifFalse;

        bool swapStatements = isResetNeg ? !resetIsActiveHigh : resetIsActiveHigh;

        if (swapStatements) {
            std::swap(resetStatement, noResetStatement);
        }

        LookupLhsIdentifier visitor(name);
        noResetStatement->visit(visitor);
        if (visitor.found()) {
            auto foundLocation = visitor.foundLocation();
            visitor.reset();
            resetStatement->visit(visitor);
            if (!visitor.found()) {
                correctlyAssignedOnIfReset = true;
                errorLocation = foundLocation;
            }
        }
    }